

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

_Type_CLASS * __thiscall
LiteScript::_Type_CLASS::ToString_abi_cxx11_(_Type_CLASS *this,Variable *object)

{
  uint uVar1;
  Object *pOVar2;
  size_type sVar3;
  const_reference this_00;
  char *pcVar4;
  ostream *poVar5;
  Variable *in_RDX;
  undefined1 local_248 [16];
  Variable local_238 [2];
  uint local_214;
  uint local_210;
  uint sz_2;
  uint i_2;
  int construct;
  Variable local_1f8 [2];
  uint local_1d8;
  uint local_1d4;
  uint sz_1;
  uint i_1;
  uint sz;
  uint i;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *inherits;
  Class *C;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Variable *local_20;
  Variable *object_local;
  _Type_CLASS *this_local;
  
  local_20 = in_RDX;
  object_local = object;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"{");
  pOVar2 = Variable::operator->(local_20);
  inherits = &Object::GetData<LiteScript::Class>(pOVar2)->inherit;
  _sz = (pointer)Class::GetInherits((Class *)inherits);
  sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)_sz);
  if (sVar3 != 0) {
    std::operator<<(local_198,"inherits:[");
    i_1 = 0;
    sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                      ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)_sz);
    sz_1 = (uint)sVar3;
    for (; i_1 < sz_1; i_1 = i_1 + 1) {
      this_00 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                          ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                           _sz,(ulong)i_1);
      pOVar2 = Variable::operator->(this_00);
      std::ostream::operator<<(local_198,pOVar2->ID);
      if (i_1 < sz_1 - 1) {
        std::operator<<(local_198,",");
      }
    }
    std::operator<<(local_198,"]");
    uVar1 = Class::GetStaticCount((Class *)inherits);
    if ((uVar1 != 0) || (uVar1 = Class::GetUnstaticCount((Class *)inherits), uVar1 != 0)) {
      std::operator<<(local_198,",");
    }
  }
  uVar1 = Class::GetStaticCount((Class *)inherits);
  if (uVar1 != 0) {
    std::operator<<(local_198,"static:{");
    local_1d4 = 0;
    local_1d8 = Class::GetStaticCount((Class *)inherits);
    for (; local_1d4 < local_1d8; local_1d4 = local_1d4 + 1) {
      pcVar4 = Class::GetStaticName((Class *)inherits,local_1d4);
      poVar5 = std::operator<<(local_198,pcVar4);
      poVar5 = std::operator<<(poVar5,":");
      Class::GetStaticMember((Class *)&i_2,(uint)inherits);
      Variable::operator_cast_to_string(local_1f8);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<(poVar5,pcVar4);
      std::__cxx11::string::~string((string *)local_1f8);
      Variable::~Variable((Variable *)&i_2);
      if (local_1d4 < local_1d8 - 1) {
        std::operator<<(local_198,",");
      }
    }
    std::operator<<(local_198,"}");
    uVar1 = Class::GetUnstaticCount((Class *)inherits);
    if (uVar1 != 0) {
      std::operator<<(local_198,",");
    }
  }
  uVar1 = Class::GetUnstaticCount((Class *)inherits);
  if (uVar1 != 0) {
    std::operator<<(local_198,"unstatic:{");
    sz_2 = Class::GetConstructorIndex((Class *)inherits);
    local_210 = 0;
    local_214 = Class::GetUnstaticCount((Class *)inherits);
    for (; local_210 < local_214; local_210 = local_210 + 1) {
      pcVar4 = Class::GetUnstaticName((Class *)inherits,local_210);
      poVar5 = std::operator<<(local_198,pcVar4);
      pcVar4 = "";
      if (local_210 == sz_2) {
        pcVar4 = "(constructor)";
      }
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5,":");
      Class::GetUnstaticMember((Class *)local_248,(uint)inherits);
      Variable::operator_cast_to_string((Variable *)(local_248 + 0x10));
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<(poVar5,pcVar4);
      std::__cxx11::string::~string((string *)(local_248 + 0x10));
      Variable::~Variable((Variable *)local_248);
      if (local_210 < local_214 - 1) {
        std::operator<<(local_198,",");
      }
    }
    std::operator<<(local_198,"}");
  }
  std::operator<<(local_198,"}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string LiteScript::_Type_CLASS::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Class& C = object->GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    if (inherits.size() > 0) {
        ss << "inherits:[";
        for (unsigned int i = 0, sz = inherits.size(); i < sz; i++) {
            ss << inherits[i]->ID;
            if (i < sz - 1)
                ss << ",";
        }
        ss << "]";
        if (C.GetStaticCount() > 0 || C.GetUnstaticCount() > 0)
            ss << ",";
    }
    if (C.GetStaticCount() > 0) {
        ss << "static:{";
        for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++) {
            ss << C.GetStaticName(i) << ":" << ((std::string)C.GetStaticMember(i)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
        ss << "}";
        if (C.GetUnstaticCount() > 0)
            ss << ",";
    }
    if (C.GetUnstaticCount() > 0) {
        ss << "unstatic:{";
        int construct = C.GetConstructorIndex();
        for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++) {
            ss << C.GetUnstaticName(i) << ((int)i == construct ? "(constructor)" : "") << ":" << ((std::string)C.GetUnstaticMember(i)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
        ss << "}";
    }
    ss << "}";
    return ss.str();
}